

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *componentName)

{
  string *componentName_local;
  cmCPackGenerator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  return componentName;
}